

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ParserAddCleanup(Parse *pParse,_func_void_sqlite3_ptr_void_ptr *xCleanup,void *pPtr)

{
  int iVar1;
  sqlite3 *in_RDX;
  code *in_RSI;
  undefined8 *in_RDI;
  ParseCleanup *pCleanup;
  undefined1 *n;
  undefined8 *puVar2;
  
  n = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3FaultSim(-0x55555556);
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)sqlite3DbMallocRaw(in_RDX,(u64)n);
  }
  else {
    puVar2 = (undefined8 *)0x0;
    sqlite3OomFault((sqlite3 *)0x0);
  }
  if (puVar2 == (undefined8 *)0x0) {
    (*in_RSI)(*in_RDI,in_RDX);
    in_RDX = (sqlite3 *)0x0;
  }
  else {
    *puVar2 = in_RDI[0x19];
    in_RDI[0x19] = puVar2;
    puVar2[1] = in_RDX;
    puVar2[2] = in_RSI;
  }
  return in_RDX;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ParserAddCleanup(
  Parse *pParse,                      /* Destroy when this Parser finishes */
  void (*xCleanup)(sqlite3*,void*),   /* The cleanup routine */
  void *pPtr                          /* Pointer to object to be cleaned up */
){
  ParseCleanup *pCleanup;
  if( sqlite3FaultSim(300) ){
    pCleanup = 0;
    sqlite3OomFault(pParse->db);
  }else{
    pCleanup = sqlite3DbMallocRaw(pParse->db, sizeof(*pCleanup));
  }
  if( pCleanup ){
    pCleanup->pNext = pParse->pCleanup;
    pParse->pCleanup = pCleanup;
    pCleanup->pPtr = pPtr;
    pCleanup->xCleanup = xCleanup;
  }else{
    xCleanup(pParse->db, pPtr);
    pPtr = 0;
#if defined(SQLITE_DEBUG) || defined(SQLITE_COVERAGE_TEST)
    pParse->earlyCleanup = 1;
#endif
  }
  return pPtr;
}